

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

TokenStrings * __thiscall
gl4cts::SparseTexture2CommitmentTestCase::createShaderTokens
          (TokenStrings *__return_storage_ptr__,SparseTexture2CommitmentTestCase *this,GLint target,
          GLint format,GLint sample,string *outputBase,string *inputBase)

{
  string *psVar1;
  string *psVar2;
  string *this_00;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  GLint local_5c;
  string local_58;
  string *local_38;
  
  local_68 = outputBase;
  local_5c = sample;
  TokenStrings::TokenStrings(__return_storage_ptr__);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  switch(format) {
  case 0x8229:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822a:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822b:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822c:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822d:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822e:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x822f:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x8230:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
    break;
  case 0x8231:
    goto LAB_00ad2682;
  case 0x8232:
    goto LAB_00ad261f;
  case 0x8233:
    goto LAB_00ad2682;
  case 0x8234:
    goto LAB_00ad261f;
  case 0x8235:
LAB_00ad2682:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_00ad2691:
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
LAB_00ad2787:
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultDefault);
LAB_00ad2840:
    psVar2 = &local_58;
    goto LAB_00ad289b;
  case 0x8236:
LAB_00ad261f:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
LAB_00ad26bf:
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
LAB_00ad282d:
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultDefault);
    goto LAB_00ad2840;
  case 0x8237:
    goto LAB_00ad2661;
  case 0x8238:
    goto LAB_00ad26b0;
  case 0x8239:
    goto LAB_00ad2661;
  case 0x823a:
    goto LAB_00ad26b0;
  case 0x823b:
LAB_00ad2661:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    goto LAB_00ad2691;
  case 0x823c:
LAB_00ad26b0:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    goto LAB_00ad26bf;
  default:
    switch(format) {
    case 0x8f94:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      break;
    case 0x8f95:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      break;
    case 0x8f96:
    case 0x8f9a:
      goto switchD_00ad23ee_caseD_8f96;
    case 0x8f97:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      goto LAB_00ad288d;
    case 0x8f98:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      break;
    case 0x8f99:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      break;
    case 0x8f9b:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
LAB_00ad288d:
      psVar2 = &__return_storage_ptr__->resultDefault;
      goto LAB_00ad289b;
    default:
      if (format == 0x8058) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x8059) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x805b) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x81a5) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x8814) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x881a) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad288d;
      }
      if (format == 0x8c3a) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        break;
      }
      if ((format == 0x8d76) || (format == 0x8d7c)) {
LAB_00ad280b:
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
        goto LAB_00ad282d;
      }
      if ((format != 0x8d82) && ((format != 0x8d88 && (format != 0x8d8e)))) {
        if (format != 0x906f) goto switchD_00ad23ee_caseD_8f96;
        goto LAB_00ad280b;
      }
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::assign((char *)&__return_storage_ptr__->resultExpected);
      goto LAB_00ad2787;
    }
  }
  psVar2 = &__return_storage_ptr__->resultDefault;
LAB_00ad289b:
  std::__cxx11::string::assign((char *)psVar2);
switchD_00ad23ee_caseD_8f96:
  std::operator+(&local_88,&local_58,"vec4");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->returnType,(string *)&local_88)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+(&bStack_a8,"u",local_68);
  std::operator+(&local_88,&bStack_a8,"2D");
  psVar2 = &__return_storage_ptr__->outputType;
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::operator+(&bStack_a8,&local_58,inputBase);
  std::operator+(&local_88,&bStack_a8,"2D");
  this_00 = (string *)&__return_storage_ptr__->inputType;
  std::__cxx11::string::operator=(this_00,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  psVar1 = &__return_storage_ptr__->pointType;
  std::__cxx11::string::assign((char *)psVar1);
  local_38 = &__return_storage_ptr__->pointDef;
  std::__cxx11::string::assign((char *)local_38);
  std::operator==(&__return_storage_ptr__->returnType,"vec4");
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->epsilon);
  if (target == 0x9102) {
    std::operator+(&bStack_a8,"u",local_68);
    std::operator+(&local_88,&bStack_a8,"2DArray");
    std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::operator+(&bStack_a8,&local_58,inputBase);
    std::operator+(&local_88,&bStack_a8,"2DMSArray");
    std::__cxx11::string::operator=(this_00,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::__cxx11::string::assign((char *)psVar1);
    std::__cxx11::string::assign((char *)local_38);
    de::toString<int>(&bStack_a8,&local_5c);
    std::operator+(&local_88,", ",&bStack_a8);
LAB_00ad2d7c:
    this_00 = (string *)&__return_storage_ptr__->sampleDef;
  }
  else {
    if (target == 0x806f) {
      std::operator+(&bStack_a8,"u",local_68);
      std::operator+(&local_88,&bStack_a8,"2DArray");
      std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&bStack_a8);
      std::operator+(&bStack_a8,&local_58,inputBase);
      std::operator+(&local_88,&bStack_a8,"3D");
      goto LAB_00ad2f38;
    }
    if (target != 0x84f5) {
      if (target == 0x8513) {
        std::operator+(&bStack_a8,"u",local_68);
        std::operator+(&local_88,&bStack_a8,"2DArray");
        std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::operator+(&bStack_a8,&local_58,inputBase);
        std::operator+(&local_88,&bStack_a8,"Cube");
        std::__cxx11::string::operator=(this_00,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::__cxx11::string::assign((char *)psVar1);
      }
      else if (target == 0x8c18) {
        std::operator+(&bStack_a8,"u",local_68);
        std::operator+(&local_88,&bStack_a8,"2D_ARRAY");
        std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::operator+(&bStack_a8,&local_58,inputBase);
        std::operator+(&local_88,&bStack_a8,"1DArray");
        std::__cxx11::string::operator=(this_00,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::__cxx11::string::assign((char *)psVar1);
      }
      else {
        if (target == 0x8c1a) {
          std::operator+(&bStack_a8,"u",local_68);
          std::operator+(&local_88,&bStack_a8,"2DArray");
          std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&bStack_a8);
          std::operator+(&bStack_a8,&local_58,inputBase);
          std::operator+(&local_88,&bStack_a8,"2DArray");
        }
        else {
          if (target != 0x9009) {
            if (target == 0x9100) {
              std::operator+(&bStack_a8,&local_58,inputBase);
              std::operator+(&local_88,&bStack_a8,"2DMS");
              std::__cxx11::string::operator=(this_00,(string *)&local_88);
              std::__cxx11::string::~string((string *)&local_88);
              std::__cxx11::string::~string((string *)&bStack_a8);
              de::toString<int>(&bStack_a8,&local_5c);
              std::operator+(&local_88,", ",&bStack_a8);
              goto LAB_00ad2d7c;
            }
            if (target != 0xde0) goto LAB_00ad2f78;
            std::operator+(&bStack_a8,"u",local_68);
            std::operator+(&local_88,&bStack_a8,"2D");
            std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::~string((string *)&bStack_a8);
            std::operator+(&bStack_a8,&local_58,inputBase);
            std::operator+(&local_88,&bStack_a8,"1D");
            std::__cxx11::string::operator=(this_00,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::__cxx11::string::~string((string *)&bStack_a8);
            std::__cxx11::string::assign((char *)psVar1);
            goto LAB_00ad2f6e;
          }
          std::operator+(&bStack_a8,"u",local_68);
          std::operator+(&local_88,&bStack_a8,"2DArray");
          std::__cxx11::string::operator=((string *)psVar2,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&bStack_a8);
          std::operator+(&bStack_a8,&local_58,inputBase);
          std::operator+(&local_88,&bStack_a8,"CubeArray");
        }
LAB_00ad2f38:
        std::__cxx11::string::operator=(this_00,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&bStack_a8);
        std::__cxx11::string::assign((char *)psVar1);
      }
LAB_00ad2f6e:
      std::__cxx11::string::assign((char *)local_38);
      goto LAB_00ad2f78;
    }
    std::operator+(&bStack_a8,&local_58,inputBase);
    std::operator+(&local_88,&bStack_a8,"2DRect");
  }
  std::__cxx11::string::operator=(this_00,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
LAB_00ad2f78:
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2CommitmentTestCase::TokenStrings SparseTexture2CommitmentTestCase::createShaderTokens(
	GLint target, GLint format, GLint sample, const std::string outputBase, const std::string inputBase)
{
	TokenStrings s;
	std::string  prefix;

	if (format == GL_R8)
	{
		s.format		 = "r8";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8_SNORM)
	{
		s.format		 = "r8_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16_SNORM)
	{
		s.format		 = "r16_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8)
	{
		s.format		 = "rg8";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8_SNORM)
	{
		s.format		 = "rg8_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16)
	{
		s.format		 = "rg16";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16_SNORM)
	{
		s.format		 = "rg16_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA8)
	{
		s.format		 = "rgba8";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA8_SNORM)
	{
		s.format		 = "rgba8_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2)
	{
		s.format		 = "rgb10_a2";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2UI)
	{
		s.format		 = "rgb10_a2ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16)
	{
		s.format		 = "rgba16";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA16_SNORM)
	{
		s.format		 = "rgba16_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R16F)
	{
		s.format		 = "r16f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16F)
	{
		s.format		 = "rg16f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA16F)
	{
		s.format		 = "rgba16f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R32F)
	{
		s.format		 = "r32f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG32F)
	{
		s.format		 = "rg32f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA32F)
	{
		s.format		 = "rgba32f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R11F_G11F_B10F)
	{
		s.format		 = "r11f_g11f_b10f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8I)
	{
		s.format		 = "r8i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R8UI)
	{
		s.format		 = "r8ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R16I)
	{
		s.format		 = "r16i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R16UI)
	{
		s.format		 = "r16ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R32I)
	{
		s.format		 = "r32i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R32UI)
	{
		s.format		 = "r32ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG8I)
	{
		s.format		 = "rg8i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG8UI)
	{
		s.format		 = "rg8ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG16I)
	{
		s.format		 = "rg16i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG16UI)
	{
		s.format		 = "rg16ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG32I)
	{
		s.format		 = "rg32i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG32UI)
	{
		s.format		 = "rg32ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA8I)
	{
		s.format		 = "rgba8i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA8UI)
	{
		s.format		 = "rgba8ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16I)
	{
		s.format		 = "rgba16i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA16UI)
	{
		s.format		 = "rgba16ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA32I)
	{
		s.format		 = "rgba32i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_DEPTH_COMPONENT16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 0)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}

	s.returnType = prefix + "vec4";
	s.outputType = "u" + outputBase + "2D";
	s.inputType  = prefix + inputBase + "2D";
	s.pointType  = "ivec2";
	s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y";

	if (s.returnType == "vec4")
		s.epsilon = "0.008";
	else
		s.epsilon = "0";

	if (target == GL_TEXTURE_1D)
	{
		s.outputType = "u" + outputBase + "2D";
		s.inputType  = prefix + inputBase + "1D";
		s.pointType  = "int";
		s.pointDef   = "gl_WorkGroupID.x";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2D_ARRAY";
		s.inputType  = prefix + inputBase + "1DArray";
		s.pointType  = "ivec2";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "3D";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "Cube";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "CubeArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_RECTANGLE)
	{
		s.inputType = prefix + inputBase + "2DRect";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE)
	{
		s.inputType = prefix + inputBase + "2DMS";
		s.sampleDef = ", " + de::toString(sample);
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DMSArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
		s.sampleDef  = ", " + de::toString(sample);
	}

	return s;
}